

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::CloudMediumProvider::Density(CloudMediumProvider *this,Point3f *p,SampledWavelengths *lambda)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Float FVar8;
  float fVar9;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar12 [64];
  undefined1 extraout_var [60];
  undefined1 auVar13 [16];
  float fVar14;
  Tuple3<pbrt::Point3,_float> local_e8;
  float local_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  Tuple3<pbrt::Point3,_float> local_a8;
  Tuple3<pbrt::Point3,_float> local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  Float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Float local_58;
  undefined1 local_48 [16];
  
  fVar14 = this->extent * 5.0;
  uVar1 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar2 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  local_b8 = (float)uVar1 * fVar14;
  fStack_b4 = (float)uVar2 * fVar14;
  fStack_b0 = fVar14 * 0.0;
  fStack_ac = fVar14 * 0.0;
  fVar14 = fVar14 * (p->super_Tuple3<pbrt::Point3,_float>).z;
  if (0.0 < this->wispiness) {
    fVar9 = this->wispiness * 0.05;
    auVar12 = ZEXT464(0x41200000);
    iVar5 = 1;
    do {
      local_48 = ZEXT416((uint)fVar9);
      local_c8._0_4_ = auVar12._0_4_;
      local_d8._0_4_ = local_b8 * (float)local_c8._0_4_;
      local_d8._4_4_ = fStack_b4 * (float)local_c8._0_4_;
      fStack_d0 = fStack_b0 * (float)local_c8._0_4_;
      fStack_cc = fStack_ac * (float)local_c8._0_4_;
      fVar9 = fVar14 * (float)local_c8._0_4_;
      local_e8._0_8_ = vmovlps_avx(_local_d8);
      local_e8.z = fVar9;
      local_c8 = auVar12._0_16_;
      local_58 = Noise((Point3f *)&local_e8);
      local_78._0_4_ = (float)local_d8._0_4_ + 0.01;
      local_78._4_4_ = (float)local_d8._4_4_ + 0.0;
      local_78._8_4_ = fStack_d0 + 0.0;
      local_78._12_4_ = fStack_cc + 0.0;
      local_e8.z = fVar9 + 0.0;
      local_e8._0_8_ = vmovlps_avx(local_78);
      local_dc = local_e8.z;
      local_68 = Noise((Point3f *)&local_e8);
      local_88 = ZEXT416((uint)(local_d8._0_4_ + 0.0));
      auVar6 = vmovshdup_avx(_local_d8);
      auVar6 = vinsertps_avx(local_88,ZEXT416((uint)(auVar6._0_4_ + 0.01)),0x10);
      local_98._0_8_ = vmovlps_avx(auVar6);
      local_98.z = local_dc;
      uStack_64 = extraout_XMM0_Db;
      uStack_60 = extraout_XMM0_Dc;
      uStack_5c = extraout_XMM0_Dd;
      local_d8._0_4_ = Noise((Point3f *)&local_98);
      local_d8._4_4_ = extraout_XMM0_Db_00;
      fStack_d0 = (float)extraout_XMM0_Dc_00;
      fStack_cc = (float)extraout_XMM0_Dd_00;
      local_a8.z = fVar9 + 0.01;
      auVar6 = vblendps_avx(local_88,local_78,2);
      local_a8._0_8_ = vmovlps_avx(auVar6);
      FVar8 = Noise((Point3f *)&local_a8);
      auVar3._4_4_ = uStack_64;
      auVar3._0_4_ = local_68;
      auVar3._8_4_ = uStack_60;
      auVar3._12_4_ = uStack_5c;
      auVar6 = vinsertps_avx(auVar3,ZEXT416((uint)local_d8._0_4_),0x10);
      auVar13._4_4_ = local_58;
      auVar13._0_4_ = local_58;
      auVar13._8_4_ = local_58;
      auVar13._12_4_ = local_58;
      auVar6 = vsubps_avx(auVar6,auVar13);
      auVar11._0_4_ = (float)local_48._0_4_ * auVar6._0_4_;
      auVar11._4_4_ = (float)local_48._0_4_ * auVar6._4_4_;
      auVar11._8_4_ = (float)local_48._0_4_ * auVar6._8_4_;
      auVar11._12_4_ = (float)local_48._0_4_ * auVar6._12_4_;
      auVar6._8_4_ = 0x3c23d70a;
      auVar6._0_8_ = 0x3c23d70a3c23d70a;
      auVar6._12_4_ = 0x3c23d70a;
      auVar6 = vdivps_avx512vl(auVar11,auVar6);
      local_b8 = local_b8 + auVar6._0_4_;
      fStack_b4 = fStack_b4 + auVar6._4_4_;
      fStack_b0 = fStack_b0 + auVar6._8_4_;
      fStack_ac = fStack_ac + auVar6._12_4_;
      fVar14 = fVar14 + ((float)local_48._0_4_ * (FVar8 - local_58)) / 0.01;
      fVar9 = (float)local_48._0_4_ * 0.5;
      auVar12 = ZEXT464((uint)((float)local_c8._0_4_ * 2.01));
      iVar5 = iVar5 + -1;
    } while (iVar5 == 0);
  }
  fVar9 = 0.5;
  local_e8.z = 1.0;
  iVar5 = 5;
  auVar6 = ZEXT816(0) << 0x40;
  do {
    local_c8 = ZEXT416((uint)local_e8.z);
    local_d8._0_4_ = auVar6._0_4_;
    auVar10._0_4_ = local_b8 * local_e8.z;
    auVar10._4_4_ = fStack_b4 * local_e8.z;
    auVar10._8_4_ = fStack_b0 * local_e8.z;
    auVar10._12_4_ = fStack_ac * local_e8.z;
    local_e8.z = fVar14 * local_e8.z;
    local_e8._0_8_ = vmovlps_avx(auVar10);
    auVar12._0_4_ = Noise((Point3f *)&local_e8);
    auVar12._4_60_ = extraout_var;
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)local_d8._0_4_),auVar12._0_16_,ZEXT416((uint)fVar9));
    fVar9 = fVar9 * 0.5;
    local_e8.z = (float)local_c8._0_4_ * 2.01;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  fVar14 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar13 = ZEXT816(0) << 0x20;
  auVar3 = vmaxss_avx(ZEXT416((uint)(0.5 - fVar14)),auVar13);
  auVar11 = ZEXT416((uint)(auVar6._0_4_ * (1.0 - fVar14) * 4.5 * this->density));
  auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
  uVar4 = vcmpss_avx512f(auVar11,auVar13,1);
  auVar7._4_12_ = auVar6._4_12_;
  auVar7._0_4_ = (uint)!(bool)((byte)uVar4 & 1) * auVar6._0_4_;
  auVar3 = vfmadd231ss_fma(auVar7,auVar3,ZEXT416(0x40000000));
  auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar3);
  uVar4 = vcmpss_avx512f(auVar3,auVar13,1);
  iVar5 = (uint)!(bool)((byte)uVar4 & 1) * auVar6._0_4_;
  return (array<float,_4>)CONCAT88(CONCAT44((float)iVar5,(float)iVar5),CONCAT44(iVar5,iVar5));
}

Assistant:

Density(const Point3f &p, const SampledWavelengths &lambda) const {
        Point3f pp = 5 * extent * p;

        // Use noise to perturb the lookup point.
        if (wispiness > 0) {
            Float vscale = .05f * wispiness, vlac = 10.f;
            for (int i = 0; i < 2; ++i) {
                Float delta = .01f;
                // TODO: update Noise() to return the gradient?
                Float base = Noise(vlac * pp);
                Point3f pd(Noise(vlac * pp + Vector3f(delta, 0, 0)),
                           Noise(vlac * pp + Vector3f(0, delta, 0)),
                           Noise(vlac * pp + Vector3f(0, 0, delta)));
                pp += vscale * (pd - Vector3f(base, base, base)) / delta;
                vscale *= 0.5f;
                vlac *= 2.01f;
            }
        }

        Float d = 0;
        Float scale = .5, lac = 1.f;
        for (int i = 0; i < 5; ++i) {
            d += scale * Noise(lac * pp);
            scale *= 0.5f;
            lac *= 2.01f;
        }

        d = Clamp((1 - p.y) * 4.5f * density * d, 0, 1);
        d += 2 * std::max<Float>(0, .5f - p.y);
        return SampledSpectrum(Clamp(d, 0, 1));
    }